

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_file_rename.c
# Opt level: O3

int zip_file_rename(zip_t *za,zip_uint64_t idx,char *name,zip_flags_t flags)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  bool bVar3;
  
  if ((idx < za->nentry) && ((name == (char *)0x0 || (sVar2 = strlen(name), sVar2 < 0x10000)))) {
    if ((za->ch_flags & 2) != 0) {
      iVar1 = 0x19;
      goto LAB_0010ad4b;
    }
    bVar3 = false;
    __s = zip_get_name(za,idx,0);
    if (__s == (char *)0x0) {
      return -1;
    }
    if (name != (char *)0x0) {
      sVar2 = strlen(name);
      bVar3 = name[sVar2 - 1] == '/';
    }
    sVar2 = strlen(__s);
    if (bVar3 == (__s[sVar2 - 1] == '/')) {
      iVar1 = _zip_set_name(za,idx,name,flags);
      return iVar1;
    }
  }
  iVar1 = 0x12;
LAB_0010ad4b:
  zip_error_set(&za->error,iVar1,0);
  return -1;
}

Assistant:

ZIP_EXTERN int
zip_file_rename(zip_t *za, zip_uint64_t idx, const char *name, zip_flags_t flags) {
    const char *old_name;
    int old_is_dir, new_is_dir;

    if (idx >= za->nentry || (name != NULL && strlen(name) > ZIP_UINT16_MAX)) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    if (ZIP_IS_RDONLY(za)) {
        zip_error_set(&za->error, ZIP_ER_RDONLY, 0);
        return -1;
    }

    if ((old_name = zip_get_name(za, idx, 0)) == NULL)
        return -1;

    new_is_dir = (name != NULL && name[strlen(name) - 1] == '/');
    old_is_dir = (old_name[strlen(old_name) - 1] == '/');

    if (new_is_dir != old_is_dir) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return -1;
    }

    return _zip_set_name(za, idx, name, flags);
}